

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O0

void parse_simple_label(parser *param_1,shared_data *sd,void *v,v_array<substring> *words)

{
  substring s;
  substring s_00;
  substring s_01;
  substring s_02;
  substring s_03;
  substring s_04;
  size_t sVar1;
  substring *psVar2;
  ostream *this;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  v_array<substring> *in_RCX;
  float *in_RDX;
  shared_data *in_RSI;
  float fVar6;
  uint i;
  label_data *ld;
  uint local_8c;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  
  sVar1 = v_array<substring>::size(in_RCX);
  switch(sVar1) {
  case 0:
    break;
  case 1:
    v_array<substring>::operator[](in_RCX,0);
    s_00.end = in_stack_ffffffffffffffc0;
    s_00.begin = in_stack_ffffffffffffffb8;
    fVar6 = float_of_substring(s_00);
    *in_RDX = fVar6;
    break;
  case 2:
    psVar2 = v_array<substring>::operator[](in_RCX,0);
    pcVar4 = psVar2->begin;
    pcVar5 = psVar2->end;
    fVar6 = float_of_substring(*psVar2);
    *in_RDX = fVar6;
    v_array<substring>::operator[](in_RCX,1);
    s_01.end = pcVar5;
    s_01.begin = pcVar4;
    fVar6 = float_of_substring(s_01);
    in_RDX[1] = fVar6;
    break;
  case 3:
    v_array<substring>::operator[](in_RCX,0);
    s_02.end = in_stack_ffffffffffffffc0;
    s_02.begin = in_stack_ffffffffffffffb8;
    fVar6 = float_of_substring(s_02);
    *in_RDX = fVar6;
    v_array<substring>::operator[](in_RCX,1);
    s_03.end = in_stack_ffffffffffffffc0;
    s_03.begin = in_stack_ffffffffffffffb8;
    fVar6 = float_of_substring(s_03);
    in_RDX[1] = fVar6;
    v_array<substring>::operator[](in_RCX,2);
    s_04.end = in_stack_ffffffffffffffc0;
    s_04.begin = in_stack_ffffffffffffffb8;
    fVar6 = float_of_substring(s_04);
    in_RDX[2] = fVar6;
    break;
  default:
    this = std::operator<<((ostream *)&std::cout,"Error: ");
    sVar1 = v_array<substring>::size(in_RCX);
    poVar3 = (ostream *)std::ostream::operator<<(this,sVar1);
    std::operator<<(poVar3," is too many tokens for a simple label: ");
    local_8c = 0;
    while( true ) {
      pcVar4 = (char *)(ulong)local_8c;
      pcVar5 = (char *)v_array<substring>::size(in_RCX);
      if (pcVar5 <= pcVar4) break;
      v_array<substring>::operator[](in_RCX,(ulong)local_8c);
      s.end = (char *)this;
      s.begin = pcVar4;
      print_substring(s);
      local_8c = local_8c + 1;
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  count_label(in_RSI,*in_RDX);
  return;
}

Assistant:

void parse_simple_label(parser*, shared_data* sd, void* v, v_array<substring>& words)
{
  label_data* ld = (label_data*)v;

  switch (words.size())
  {
    case 0:
      break;
    case 1:
      ld->label = float_of_substring(words[0]);
      break;
    case 2:
      ld->label = float_of_substring(words[0]);
      ld->weight = float_of_substring(words[1]);
      break;
    case 3:
      ld->label = float_of_substring(words[0]);
      ld->weight = float_of_substring(words[1]);
      ld->initial = float_of_substring(words[2]);
      break;
    default:
      cout << "Error: " << words.size() << " is too many tokens for a simple label: ";
      for (unsigned int i = 0; i < words.size(); ++i) print_substring(words[i]);
      cout << endl;
  }
  count_label(sd, ld->label);
}